

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmWindowsRegistry.cxx
# Opt level: O0

void __thiscall
anon_unknown.dwarf_190fc3f::ExpressionParser::ExpressionParser
          (ExpressionParser *this,string_view expression)

{
  string_view sVar1;
  allocator<char> local_21;
  ExpressionParser *local_20;
  ExpressionParser *this_local;
  string_view expression_local;
  
  expression_local._M_len = (size_t)expression._M_str;
  this_local = (ExpressionParser *)expression._M_len;
  local_20 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)this,(basic_string_view<char,_std::char_traits<char>_> *)&this_local,
             &local_21);
  std::allocator<char>::~allocator(&local_21);
  sVar1 = (string_view)::cm::operator____s(";",1);
  this->Separator = sVar1;
  cmsys::RegularExpression::RegularExpression
            (&this->RegistryFormat,
             "\\[({.+})?(HKCU|HKEY_CURRENT_USER|HKLM|HKEY_LOCAL_MACHINE|HKCR|HKEY_CLASSES_ROOT|HKCC|HKEY_CURRENT_CONFIG|HKU|HKEY_USERS)[/\\]?([^]]*)\\]"
            );
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&this->RootKey);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&this->SubKey);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&this->ValueName);
  return;
}

Assistant:

ExpressionParser(cm::string_view expression)
    : Expression(expression)
    , Separator(";"_s)
    , RegistryFormat{
      "\\[({.+})?(HKCU|HKEY_CURRENT_USER|HKLM|HKEY_LOCAL_MACHINE|HKCR|HKEY_"
      "CLASSES_"
      "ROOT|HKCC|HKEY_CURRENT_CONFIG|HKU|HKEY_USERS)[/\\]?([^]]*)\\]"
    }
  {
  }